

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subprocess.cpp
# Opt level: O3

void llbuild::basic::spawnProcess
               (ProcessDelegate *delegate,ProcessContext *ctx,ProcessGroup *pgrp,
               ProcessHandle handle,ArrayRef<llvm::StringRef> commandLine,
               POSIXEnvironment *environment,ProcessAttributes attr,ProcessReleaseFn *releaseFn,
               ProcessCompletionFn *completionFn)

{
  _Manager_type p_Var1;
  _Invoker_type p_Var2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  StringRef value;
  StringRef value_00;
  ProcessHandle PVar6;
  ProcessHandle PVar7;
  FileDescriptor FVar8;
  FileDescriptor __fd;
  ProcessGroup *pPVar9;
  pointer __argv;
  undefined4 __fd_00;
  bool bVar10;
  char cVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar15;
  uint *puVar16;
  ulong uVar17;
  long *plVar18;
  char **__envp;
  int *piVar19;
  ssize_t sVar20;
  char *pcVar21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 *puVar22;
  Twine *pTVar23;
  NodeKind NVar24;
  long lVar25;
  byte bVar26;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar27;
  bool bVar28;
  int i;
  int iVar29;
  uint uVar30;
  Child CVar31;
  NodeKind NVar32;
  StringRef *pSVar33;
  Child CVar34;
  Child RHS;
  ProcessContext *pPVar35;
  pollfd *__fds;
  ProcessDelegate *pPVar36;
  bool bVar37;
  StringRef key;
  StringRef key_00;
  StringRef Name;
  ManagedDescriptor outputPipeParentEnd;
  ManagedDescriptor controlPipeParentEnd;
  pollfd readfds [2];
  longlong controlFd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argsStorage;
  vector<const_char_*,_std::allocator<const_char_*>_> args;
  string workingDir;
  ControlProtocolState control;
  posix_spawn_file_actions_t fileActions;
  Twine taskID;
  posix_spawnattr_t attributes;
  sigset_t mostSignals;
  ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> res;
  sigset_t noSignals;
  uint local_157c;
  undefined1 local_1578 [16];
  undefined2 local_1568;
  undefined6 uStack_1566;
  ProcessContext *local_1558;
  ProcessHandle local_1550;
  ProcessDelegate *local_1548;
  int local_153c;
  undefined1 local_1538 [16];
  undefined1 local_1528 [28];
  undefined4 local_150c;
  Child local_1508;
  Child CStack_1500;
  undefined2 local_14f8;
  undefined6 uStack_14f6;
  ManagedDescriptor local_14e8;
  Child local_14d0;
  Child CStack_14c8;
  NodeKind local_14c0;
  char cStack_14bf;
  undefined6 uStack_14be;
  Child local_14b8;
  Child CStack_14b0;
  NodeKind local_14a8;
  char cStack_14a7;
  undefined6 uStack_14a6;
  ManagedDescriptor local_14a0;
  pollfd local_1488;
  pollfd pStack_1480;
  NodeKind local_1478;
  char cStack_1477;
  undefined6 uStack_1476;
  Child local_1468;
  ProcessGroup *local_1460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1458;
  Child local_1448;
  code *local_1440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1438;
  code *local_1428 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1418;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_13f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_13f0;
  pthread_mutex_t *local_13e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_13e0;
  vector<const_char_*,_std::allocator<const_char_*>_> local_13d0;
  Child local_13b8;
  undefined8 uStack_13b0;
  NodeKind local_13a8;
  char cStack_13a7;
  undefined6 uStack_13a6;
  Child local_13a0;
  undefined8 uStack_1398;
  NodeKind local_1390;
  char cStack_138f;
  undefined6 uStack_138e;
  undefined1 *local_1388;
  long local_1380;
  undefined1 local_1378;
  undefined7 uStack_1377;
  Child local_1368 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1358;
  undefined1 local_1348;
  undefined1 *local_1340;
  undefined8 local_1338;
  undefined1 local_1330;
  undefined7 uStack_132f;
  char local_1320;
  undefined8 local_1318;
  undefined4 uStack_130c;
  undefined4 local_1308;
  undefined4 uStack_1304;
  undefined4 uStack_1300;
  undefined4 uStack_12fc;
  undefined8 local_12f8;
  posix_spawn_file_actions_t local_12f0;
  Twine local_12a0;
  posix_spawnattr_t local_1288;
  sigset_t local_1138;
  undefined1 local_10b8 [8];
  Child CStack_10b0;
  undefined1 auStack_10a8 [16];
  ulong local_1098;
  sigset_t local_b0;
  
  local_157c = 0xffffffff;
  if (attr.connectToConsole == true) {
    attr.controlEnabled = false;
  }
  local_1558 = ctx;
  local_1550.id = handle.id;
  local_1460 = pgrp;
  if (commandLine.Length == 0) {
    local_1288.__flags = 1;
    local_1288._2_2_ = 0;
    local_1288.__pgrp = -1;
    local_1288.__sd.__val[0]._0_4_ = 0xffffffff;
    local_1288.__sd.__val[1] = 0;
    local_1288.__sd.__val[2] = 0;
    local_1288.__sd.__val[3] = 0;
    (*delegate->_vptr_ProcessDelegate[2])(delegate,ctx,handle.id,0xffffffff);
    llvm::Twine::Twine((Twine *)local_10b8,"no arguments for command");
    (*delegate->_vptr_ProcessDelegate[3])(delegate,ctx,handle.id,(Twine *)local_10b8);
    (*delegate->_vptr_ProcessDelegate[5])(delegate,ctx,local_1550.id,&local_1288);
    local_1098 = local_1288.__sd.__val[3];
    auStack_10a8._0_4_ = (undefined4)local_1288.__sd.__val[1];
    auStack_10a8._4_4_ = (undefined4)(local_1288.__sd.__val[1] >> 0x20);
    auStack_10a8._8_4_ = (undefined4)local_1288.__sd.__val[2];
    auStack_10a8._12_4_ = (undefined4)(local_1288.__sd.__val[2] >> 0x20);
    local_10b8._0_4_ = local_1288._0_4_;
    local_10b8._4_4_ = local_1288.__pgrp;
    CStack_10b0.decUI = (uint)local_1288.__sd.__val[0];
    CStack_10b0._4_4_ = local_1288.__sd.__val[0]._4_4_;
    if ((completionFn->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*completionFn->_M_invoker)((_Any_data *)completionFn,(ProcessResult *)local_10b8);
      return;
    }
    goto LAB_00165ea0;
  }
  pSVar33 = commandLine.Data + commandLine.Length;
  local_1418.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_1418.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_1418.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_initialize<llvm::StringRef_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1418,
             commandLine.Data,pSVar33);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_13d0,
             ((long)local_1418.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_1418.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) + 1,(allocator_type *)local_10b8
            );
  if (local_1418.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_1418.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar14 = 0;
  }
  else {
    lVar25 = 0;
    lVar14 = 0;
    do {
      local_13d0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar14] =
           *(char **)((long)&((local_1418.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar25);
      lVar14 = lVar14 + 1;
      lVar25 = lVar25 + 0x20;
    } while (lVar14 != (long)local_1418.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_1418.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5);
  }
  local_13d0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start[lVar14] = (char *)0x0;
  posix_spawnattr_init(&local_1288);
  sigemptyset(&local_b0);
  posix_spawnattr_setsigmask(&local_1288,&local_b0);
  sigemptyset(&local_1138);
  iVar29 = 1;
  do {
    if ((iVar29 != 9) && (iVar29 != 0x13)) {
      sigaddset(&local_1138,iVar29);
    }
    iVar29 = iVar29 + 1;
  } while (iVar29 != 0x1f);
  posix_spawnattr_setsigdefault(&local_1288,&local_1138);
  posix_spawnattr_setpgroup(&local_1288,0);
  posix_spawnattr_setflags(&local_1288,(ushort)(attr.connectToConsole ^ 1) * 2 + 0xc);
  posix_spawn_file_actions_init(&local_12f0);
  local_1388 = &local_1378;
  local_1548 = delegate;
  if (attr.workingDir.Data == (char *)0x0) {
    local_1380 = 0;
    local_1378 = 0;
LAB_00164616:
    bVar37 = false;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1388,attr.workingDir.Data,
               attr.workingDir.Data + attr.workingDir.Length);
    if (local_1380 == 0) goto LAB_00164616;
    iVar29 = posix_spawn_file_actions_addchdir_np(&local_12f0,local_1388);
    bVar37 = iVar29 != 0x26;
  }
  local_14e8._descriptor = 0xffffffff;
  local_14e8._closedProperly = true;
  local_14e8._file =
       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp"
  ;
  local_14e8._line = 799;
  local_14a0._descriptor = 0xffffffff;
  local_14a0._closedProperly = true;
  local_14a0._file =
       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp"
  ;
  local_14a0._line = 800;
  llvm::Twine::Twine(&local_12a0,(Twine *)&local_1550,UHexKind,(Child)0x0,EmptyKind);
  llvm::Twine::str_abi_cxx11_((string *)local_10b8,&local_12a0);
  value.Data._4_4_ = local_10b8._4_4_;
  value.Data._0_4_ = local_10b8._0_4_;
  value.Length._0_4_ = CStack_10b0.decUI;
  value.Length._4_4_ = CStack_10b0._4_4_;
  key.Length = 0xf;
  key.Data = "LLBUILD_TASK_ID";
  POSIXEnvironment::setIfMissing(environment,key,value);
  CVar31.twine = (Twine *)auStack_10a8;
  if ((Twine *)CONCAT44(local_10b8._4_4_,local_10b8._0_4_) != CVar31.twine) {
    operator_delete((Twine *)CONCAT44(local_10b8._4_4_,local_10b8._0_4_),
                    CONCAT44(auStack_10a8._4_4_,auStack_10a8._0_4_) + 1);
  }
  llvm::Twine::Twine((Twine *)local_10b8,
                     local_1418.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  bVar10 = llvm::sys::path::is_absolute((Twine *)local_10b8,native);
  if (!bVar10) {
    Name.Length = 0;
    Name.Data = (char *)(local_1418.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = pSVar33;
    llvm::sys::findProgramByName_abi_cxx11_
              ((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_10b8,
               (sys *)((local_1418.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,Name,
               (ArrayRef<llvm::StringRef>)(auVar3 << 0x40));
    if ((local_1098 & 1) == 0) {
      std::__cxx11::string::_M_assign
                ((string *)
                 local_1418.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      *local_13d0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_start =
           ((local_1418.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    }
    else if (local_10b8._0_4_ == 0) {
      __assert_fail("!HasError && \"Cannot get value when an error exists!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/ErrorOr.h"
                    ,0xf4,
                    "storage_type *llvm::ErrorOr<std::basic_string<char>>::getStorage() [T = std::basic_string<char>]"
                   );
    }
    if ((((NodeKind)local_1098 & EmptyKind) == NullKind) &&
       ((Twine *)CONCAT44(local_10b8._4_4_,local_10b8._0_4_) != CVar31.twine)) {
      operator_delete((Twine *)CONCAT44(local_10b8._4_4_,local_10b8._0_4_),
                      CONCAT44(auStack_10a8._4_4_,auStack_10a8._0_4_) + 1);
    }
  }
  pPVar9 = local_1460;
  local_13e8 = (pthread_mutex_t *)&local_1460->mutex;
  iVar29 = pthread_mutex_lock(local_13e8);
  if (iVar29 != 0) {
    std::__throw_system_error(iVar29);
  }
  bVar26 = pPVar9->closed;
  if (pPVar9->closed == false) {
    local_13f8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((ulong)local_13f8 & 0xffffffffffffff00);
    if (attr.connectToConsole != false) {
      posix_spawn_file_actions_adddup2(&local_12f0,0,0);
      posix_spawn_file_actions_adddup2(&local_12f0,1,1);
      posix_spawn_file_actions_adddup2(&local_12f0,2,2);
      iVar29 = -1;
LAB_001648eb:
      cVar11 = attr.connectToConsole;
      if (attr.controlEnabled != true) goto LAB_00164b40;
      local_10b8._0_4_ = 0xffffffff;
      local_10b8._4_4_ = -1;
      iVar12 = sys::pipe((int *)local_10b8);
      __fd = local_14a0._descriptor;
      FVar8 = local_14e8._descriptor;
      if (iVar12 < 0) {
        if (-1 < local_14e8._descriptor) {
          local_14e8._descriptor = 0xffffffff;
          local_14e8._closedProperly = true;
          sys::close(FVar8);
        }
        if (-1 < iVar29) {
          sys::close(iVar29);
          cVar11 = '\x01';
          iVar29 = -1;
        }
        puVar16 = (uint *)__errno_location();
        uVar17 = (ulong)*puVar16 << 0x20 | 2;
        goto LAB_00164a59;
      }
      local_153c = iVar29;
      if (-1 < local_14a0._descriptor) {
        local_14a0._descriptor = -1;
        local_14a0._closedProperly = true;
        sys::close(__fd);
      }
      local_14a0._descriptor = local_10b8._0_4_;
      local_14a0._4_4_ = local_14a0._4_4_ & 0xffffff00;
      local_10b8._0_4_ = 0xffffffff;
      ManagedDescriptor::childMayInherit(&local_14a0,false);
      __fd_00 = local_10b8._4_4_;
      CVar34 = (Child)(long)(int)local_10b8._4_4_;
      local_10b8._4_4_ = -1;
      posix_spawn_file_actions_adddup2(&local_12f0,__fd_00,__fd_00);
      if ((long)CVar34.twine < 0) {
        local_150c = 0;
      }
      else {
        local_1368[0].twine = (Twine *)&local_1458;
        local_1358._M_allocated_capacity._0_2_ = 0x10e;
        local_1458._M_allocated_capacity = (size_type)CVar34;
        llvm::Twine::str_abi_cxx11_((string *)local_10b8,(Twine *)local_1368);
        value_00.Data._4_4_ = local_10b8._4_4_;
        value_00.Data._0_4_ = local_10b8._0_4_;
        value_00.Length._0_4_ = CStack_10b0.decUI;
        value_00.Length._4_4_ = CStack_10b0._4_4_;
        key_00.Length = 0x12;
        key_00.Data = "LLBUILD_CONTROL_FD";
        POSIXEnvironment::setIfMissing(environment,key_00,value_00);
        uVar15 = extraout_RAX;
        if ((Twine *)CONCAT44(local_10b8._4_4_,local_10b8._0_4_) != CVar31.twine) {
          operator_delete((Twine *)CONCAT44(local_10b8._4_4_,local_10b8._0_4_),
                          CONCAT44(auStack_10a8._4_4_,auStack_10a8._0_4_) + 1);
          uVar15 = extraout_RAX_00;
        }
        local_150c = (undefined4)CONCAT71((int7)((ulong)uVar15 >> 8),1);
      }
      bVar26 = 0;
LAB_00164b61:
      __argv = local_13d0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar37 = (bool)(bVar37 | local_1380 == 0);
      iVar29 = -1;
      if (bVar37) {
        pcVar21 = *local_13d0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        __envp = POSIXEnvironment::getEnvp(environment);
        iVar29 = posix_spawn((pid_t *)&local_157c,pcVar21,&local_12f0,&local_1288,__argv,__envp);
      }
      (*local_1548->_vptr_ProcessDelegate[2])(local_1548,local_1558,local_1550.id,(ulong)local_157c)
      ;
      PVar6.id = local_1550.id;
      if (iVar29 == 0) {
        local_10b8[4] = attr.canSafelyInterrupt;
        local_10b8._0_4_ = local_157c;
        std::
        _Hashtable<int,std::pair<int_const,llbuild::basic::ProcessInfo>,std::allocator<std::pair<int_const,llbuild::basic::ProcessInfo>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<int,llbuild::basic::ProcessInfo>>(local_1460);
        iVar29 = local_153c;
      }
      else {
        local_10b8._0_4_ = 1;
        local_10b8._4_4_ = -1;
        CStack_10b0.decUI = 0xffffffff;
        auStack_10a8[0] = NullKind;
        auStack_10a8[1] = NullKind;
        auStack_10a8._2_2_ = 0;
        auStack_10a8._4_4_ = 0;
        auStack_10a8._8_4_ = 0;
        auStack_10a8._12_4_ = 0;
        local_1098 = 0;
        local_1468 = CVar34;
        if (bVar37) {
          llvm::Twine::Twine((Twine *)&local_14b8,"unable to spawn process \'");
          llvm::Twine::Twine((Twine *)&local_14d0,
                             local_1418.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          if ((local_14a8 == NullKind) || (local_14c0 == NullKind)) {
            local_14f8 = 0x100;
          }
          else if (local_14a8 == EmptyKind) {
            local_14f8._1_1_ = cStack_14bf;
            local_14f8._0_1_ = local_14c0;
            uStack_14f6 = uStack_14be;
            local_1508 = local_14d0;
            CStack_1500 = CStack_14c8;
          }
          else if (local_14c0 == EmptyKind) {
            local_14f8._1_1_ = cStack_14a7;
            local_14f8._0_1_ = local_14a8;
            uStack_14f6 = uStack_14a6;
            local_1508 = local_14b8;
            CStack_1500 = CStack_14b0;
          }
          else {
            CVar31 = local_14b8;
            NVar24 = local_14a8;
            if (cStack_14a7 != '\x01') {
              CVar31.twine = (Twine *)&local_14b8;
              NVar24 = TwineKind;
            }
            CVar34 = local_14d0;
            NVar32 = local_14c0;
            if (cStack_14bf != '\x01') {
              CVar34.twine = (Twine *)&local_14d0;
              NVar32 = TwineKind;
            }
            llvm::Twine::Twine((Twine *)&local_1508,CVar31,NVar24,CVar34,NVar32);
          }
          llvm::Twine::Twine((Twine *)&local_1488,"\' (");
          pPVar36 = local_1548;
          if (((NodeKind)local_14f8 == NullKind) || (local_1478 == NullKind)) {
            local_1568 = 0x100;
          }
          else {
            if ((NodeKind)local_14f8 == EmptyKind) {
              local_1568._1_1_ = cStack_1477;
              local_1568._0_1_ = local_1478;
              uStack_1566 = uStack_1476;
              local_1578._4_2_ = local_1488.events;
              local_1578._0_4_ = local_1488.fd;
              local_1578._6_2_ = local_1488.revents;
              local_1578._12_2_ = pStack_1480.events;
              local_1578._8_4_ = pStack_1480.fd;
              local_1578._14_2_ = pStack_1480.revents;
            }
            else {
              if (local_1478 != EmptyKind) {
                CVar31 = local_1508;
                NVar24 = (NodeKind)local_14f8;
                if (local_14f8._1_1_ != EmptyKind) {
                  CVar31.twine = (Twine *)&local_1508;
                  NVar24 = TwineKind;
                }
                if (cStack_1477 != '\x01') {
                  local_1478 = TwineKind;
                }
                CVar34._4_2_ = local_1488.events;
                CVar34.decUI = local_1488.fd;
                CVar34._6_2_ = local_1488.revents;
                RHS.twine = (Twine *)&local_1488;
                if (cStack_1477 == '\x01') {
                  RHS = CVar34;
                }
                llvm::Twine::Twine((Twine *)local_1578,CVar31,NVar24,RHS,local_1478);
                goto LAB_00164f0c;
              }
              local_1568._0_1_ = (NodeKind)local_14f8;
              local_1568._1_1_ = local_14f8._1_1_;
              uStack_1566 = uStack_14f6;
              local_1578._0_8_ = local_1508;
              local_1578._8_8_ = CStack_1500;
            }
          }
LAB_00164f0c:
          sys::strerror_abi_cxx11_((sys *)&local_1368[0].character,iVar29);
          llvm::Twine::Twine((Twine *)&local_13a0,(string *)local_1368);
          CVar34 = local_1468;
          if (((NodeKind)local_1568 == NullKind) || (local_1390 == NullKind)) {
            local_1528._0_2_ = 0x100;
          }
          else if ((NodeKind)local_1568 == EmptyKind) {
            local_1528[1] = cStack_138f;
            local_1528[0] = local_1390;
            local_1528._2_6_ = uStack_138e;
            local_1538._8_8_ = uStack_1398;
            local_1538._0_8_ = local_13a0.twine;
          }
          else if (local_1390 == EmptyKind) {
            local_1528[0] = (NodeKind)local_1568;
            local_1528[1] = local_1568._1_1_;
            local_1528._2_6_ = uStack_1566;
            local_1538 = local_1578;
          }
          else {
            CVar31 = (Child)local_1578._0_8_;
            NVar24 = (NodeKind)local_1568;
            if (local_1568._1_1_ != EmptyKind) {
              CVar31.twine = (Twine *)local_1578;
              NVar24 = TwineKind;
            }
            if (cStack_138f != '\x01') {
              local_1390 = TwineKind;
              local_13a0.twine = (Twine *)&local_13a0;
            }
            llvm::Twine::Twine((Twine *)local_1538,CVar31,NVar24,local_13a0,local_1390);
          }
          llvm::Twine::Twine((Twine *)&local_13b8,")");
          if ((local_1528[0] == NullKind) || (local_13a8 == NullKind)) {
            local_1448.decUI._0_2_ = 0x100;
          }
          else if (local_1528[0] == EmptyKind) {
            local_1448.decUI._1_1_ = cStack_13a7;
            local_1448.character = local_13a8;
            local_1448._2_6_ = uStack_13a6;
            local_1458._M_allocated_capacity = (size_type)local_13b8;
            local_1458._8_8_ = uStack_13b0;
          }
          else if (local_13a8 == EmptyKind) {
            local_1448 = (Child)local_1528._0_8_;
            local_1458._M_allocated_capacity = local_1538._0_8_;
            local_1458._8_8_ = local_1538._8_8_;
          }
          else {
            CVar31 = (Child)local_1538._0_8_;
            NVar24 = local_1528[0];
            if (local_1528[1] != EmptyKind) {
              CVar31.twine = (Twine *)local_1538;
              NVar24 = TwineKind;
            }
            if (cStack_13a7 != '\x01') {
              local_13a8 = TwineKind;
              local_13b8.twine = (Twine *)&local_13b8;
            }
            llvm::Twine::Twine((Twine *)&local_1458,CVar31,NVar24,local_13b8,local_13a8);
          }
          (*pPVar36->_vptr_ProcessDelegate[3])(pPVar36,local_1558,PVar6.id,&local_1458);
          iVar29 = local_153c;
          pPVar35 = local_1558;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1368[0].twine != &local_1358) {
            operator_delete(local_1368[0].twine,
                            CONCAT62(local_1358._M_allocated_capacity._2_6_,
                                     local_1358._M_allocated_capacity._0_2_) + 1);
            pPVar35 = local_1558;
          }
        }
        else {
          llvm::Twine::Twine((Twine *)&local_1458,"working-directory unsupported on this platform");
          pPVar36 = local_1548;
          pPVar35 = local_1558;
          (*local_1548->_vptr_ProcessDelegate[3])(local_1548,local_1558,PVar6.id,&local_1458);
          CVar34 = local_1468;
          iVar29 = local_153c;
        }
        (*pPVar36->_vptr_ProcessDelegate[5])(pPVar36,pPVar35,local_1550.id,local_10b8);
        local_157c = 0xffffffff;
      }
      iVar12 = CVar34.decI;
      if ((char)local_150c != '\0') {
        sys::close(iVar12);
        bVar26 = 1;
        iVar12 = -1;
      }
      if (-1 < iVar29) {
        sys::close(iVar29);
        cVar11 = '\x01';
      }
      if ((!(bool)(iVar12 < 0 & bVar26)) || (bVar26 = (byte)local_13f8, cVar11 == '\0'))
      goto LAB_00165ea5;
      goto LAB_00165164;
    }
    posix_spawn_file_actions_addopen(&local_12f0,0,"/dev/null",0,0);
    local_10b8._0_4_ = 0xffffffff;
    local_10b8._4_4_ = -1;
    iVar29 = sys::pipe((int *)local_10b8);
    FVar8 = local_14e8._descriptor;
    if (-1 < iVar29) {
      if (-1 < local_14e8._descriptor) {
        local_14e8._descriptor = -1;
        local_14e8._closedProperly = true;
        sys::close(FVar8);
      }
      local_14e8._descriptor = local_10b8._0_4_;
      local_14e8._4_4_ = local_14e8._4_4_ & 0xffffff00;
      local_10b8._0_4_ = 0xffffffff;
      ManagedDescriptor::childMayInherit(&local_14e8,false);
      iVar29 = local_10b8._4_4_;
      local_10b8._4_4_ = -1;
      posix_spawn_file_actions_adddup2(&local_12f0,iVar29,1);
      posix_spawn_file_actions_adddup2(&local_12f0,iVar29,2);
      posix_spawn_file_actions_addclose(&local_12f0,iVar29);
      goto LAB_001648eb;
    }
    puVar16 = (uint *)__errno_location();
    uVar17 = ((ulong)*puVar16 << 0x20) + 1;
    cVar11 = '\x01';
    iVar29 = -1;
LAB_00164a59:
    iVar12 = (int)uVar17;
    if (iVar12 == 0) {
LAB_00164b40:
      bVar26 = 1;
      CVar34 = (Child)0xffffffff;
      local_150c = 0;
      local_153c = iVar29;
      goto LAB_00164b61;
    }
    pcVar21 = "control pipe";
    if (iVar12 == 1) {
      pcVar21 = "output pipe";
    }
    local_1368[0].twine = (Twine *)&local_1358;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1368,pcVar21,pcVar21 + (0xc - (ulong)(iVar12 == 1)));
    posix_spawn_file_actions_destroy(&local_12f0);
    posix_spawnattr_destroy(&local_1288);
    (*local_1548->_vptr_ProcessDelegate[2])(local_1548,local_1558,local_1550.id,(ulong)local_157c);
    PVar6.id = local_1550.id;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1458,
                   "unable to open ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1368);
    plVar18 = (long *)std::__cxx11::string::append(local_1458._M_local_buf);
    pTVar23 = (Twine *)(plVar18 + 2);
    if ((Twine *)*plVar18 == pTVar23) {
      auStack_10a8._0_4_ = (pTVar23->LHS).decUI;
      auStack_10a8._4_4_ = SUB84(pTVar23->LHS,4);
      auStack_10a8._8_4_ = (undefined4)plVar18[3];
      auStack_10a8._12_4_ = (undefined4)((ulong)plVar18[3] >> 0x20);
    }
    else {
      auStack_10a8._0_4_ = (pTVar23->LHS).decUI;
      auStack_10a8._4_4_ = SUB84(pTVar23->LHS,4);
      CVar31.twine = (Twine *)*plVar18;
    }
    CStack_10b0.decUI = (uint)plVar18[1];
    CStack_10b0._4_4_ = (undefined4)((ulong)plVar18[1] >> 0x20);
    *plVar18 = (long)pTVar23;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    local_10b8 = (undefined1  [8])CVar31;
    llvm::Twine::Twine((Twine *)&local_1508,(string *)local_10b8);
    pcVar21 = strerror((int)(uVar17 >> 0x20));
    llvm::Twine::Twine((Twine *)&local_14b8,pcVar21);
    if (((NodeKind)local_14f8 == NullKind) || (local_14a8 == NullKind)) {
      local_1568 = 0x100;
    }
    else {
      if ((NodeKind)local_14f8 == EmptyKind) {
        local_1568._1_1_ = cStack_14a7;
        local_1568._0_1_ = local_14a8;
        uStack_1566 = uStack_14a6;
      }
      else {
        if (local_14a8 != EmptyKind) {
          NVar24 = (NodeKind)local_14f8;
          if (local_14f8._1_1_ != EmptyKind) {
            local_1508.twine = (Twine *)&local_1508;
            NVar24 = TwineKind;
          }
          if (cStack_14a7 != '\x01') {
            local_14a8 = TwineKind;
            local_14b8.twine = (Twine *)&local_14b8;
          }
          llvm::Twine::Twine((Twine *)local_1578,local_1508,NVar24,local_14b8,local_14a8);
          goto LAB_00165c40;
        }
        local_1568._0_1_ = (NodeKind)local_14f8;
        local_1568._1_1_ = local_14f8._1_1_;
        uStack_1566 = uStack_14f6;
        local_14b8 = local_1508;
        CStack_14b0 = CStack_1500;
      }
      local_1578._8_8_ = CStack_14b0.twine;
      local_1578._0_8_ = local_14b8.twine;
    }
LAB_00165c40:
    llvm::Twine::Twine((Twine *)&local_14d0,")");
    pPVar36 = local_1548;
    if (((NodeKind)local_1568 == NullKind) || (local_14c0 == NullKind)) {
      local_1528._0_2_ = 0x100;
    }
    else {
      if ((NodeKind)local_1568 == EmptyKind) {
        uVar5._1_1_ = cStack_14bf;
        uVar5._0_1_ = local_14c0;
        uVar5._2_6_ = uStack_14be;
      }
      else {
        if (local_14c0 != EmptyKind) {
          CVar31 = (Child)local_1578._0_8_;
          NVar24 = (NodeKind)local_1568;
          if (local_1568._1_1_ != EmptyKind) {
            CVar31.twine = (Twine *)local_1578;
            NVar24 = TwineKind;
          }
          if (cStack_14bf != '\x01') {
            local_14c0 = TwineKind;
            local_14d0.twine = (Twine *)&local_14d0;
          }
          llvm::Twine::Twine((Twine *)local_1538,CVar31,NVar24,local_14d0,local_14c0);
          goto LAB_00165cf6;
        }
        local_14d0 = (Child)local_1578._0_8_;
        CStack_14c8 = (Child)local_1578._8_8_;
        uVar5 = _local_1568;
      }
      local_1528[0] = (NodeKind)uVar5;
      local_1528[1] = SUB81(uVar5,1);
      local_1528._2_6_ = SUB86(uVar5,2);
      local_1538._8_8_ = CStack_14c8.twine;
      local_1538._0_8_ = local_14d0.twine;
    }
LAB_00165cf6:
    (*pPVar36->_vptr_ProcessDelegate[3])(pPVar36,local_1558,PVar6.id,local_1538);
    if (local_10b8 != (undefined1  [8])auStack_10a8) {
      operator_delete((void *)local_10b8,CONCAT44(auStack_10a8._4_4_,auStack_10a8._0_4_) + 1);
    }
    if ((Child *)local_1458._M_allocated_capacity != &local_1448) {
      operator_delete((void *)local_1458._M_allocated_capacity,
                      (ulong)((long)&(local_1448.twine)->LHS + 1));
    }
    local_10b8._0_4_ = 1;
    local_10b8._4_4_ = 0xffffffff;
    CStack_10b0.decUI = 0xffffffff;
    auStack_10a8[0] = NullKind;
    auStack_10a8[1] = NullKind;
    auStack_10a8._2_2_ = 0;
    auStack_10a8._4_4_ = 0;
    auStack_10a8._8_4_ = 0;
    auStack_10a8._12_4_ = 0;
    local_1098 = 0;
    (*local_1548->_vptr_ProcessDelegate[5])(local_1548,local_1558,local_1550.id,local_10b8);
    local_10b8._0_4_ = 1;
    local_10b8._4_4_ = -1;
    CStack_10b0.decUI = 0xffffffff;
    auStack_10a8[0] = NullKind;
    auStack_10a8[1] = NullKind;
    auStack_10a8._2_2_ = 0;
    auStack_10a8._4_4_ = 0;
    auStack_10a8._8_4_ = 0;
    auStack_10a8._12_4_ = 0;
    local_1098 = 0;
    if ((completionFn->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00165ea0;
    (*completionFn->_M_invoker)((_Any_data *)completionFn,(ProcessResult *)local_10b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1368[0].twine != &local_1358) {
      operator_delete(local_1368[0].twine,
                      CONCAT62(local_1358._M_allocated_capacity._2_6_,
                               local_1358._M_allocated_capacity._0_2_) + 1);
    }
    if (cVar11 == '\0') goto LAB_00165ea5;
    pthread_mutex_unlock(local_13e8);
  }
  else {
LAB_00165164:
    pthread_mutex_unlock(local_13e8);
    posix_spawn_file_actions_destroy(&local_12f0);
    posix_spawnattr_destroy(&local_1288);
    FVar8 = local_14e8._descriptor;
    if (local_157c == 0xffffffff) {
      if (-1 < local_14e8._descriptor) {
        local_14e8._descriptor = 0xffffffff;
        local_14e8._closedProperly = true;
        sys::close(FVar8);
      }
      FVar8 = local_14a0._descriptor;
      if (-1 < local_14a0._descriptor) {
        local_14a0._descriptor = 0xffffffff;
        local_14a0._closedProperly = true;
        sys::close(FVar8);
      }
      local_1308 = 0;
      uStack_1304 = 0;
      uStack_1300 = 0;
      uStack_12fc = 0;
      local_12f8 = 0;
      local_10b8._0_4_ = bVar26 + 1;
      local_10b8._4_4_ = -1;
      CStack_10b0.decUI = 0xffffffff;
      auStack_10a8._12_4_ = 0;
      local_1098 = 0;
      CStack_10b0._4_4_ = uStack_130c;
      auStack_10a8[0] = NullKind;
      auStack_10a8[1] = NullKind;
      auStack_10a8._2_2_ = 0;
      auStack_10a8._4_4_ = 0;
      auStack_10a8._8_4_ = 0;
      if ((completionFn->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_00165ea0:
        std::__throw_bad_function_call();
      }
      (*completionFn->_M_invoker)((_Any_data *)completionFn,(ProcessResult *)local_10b8);
    }
    else {
      local_1488.fd = local_14e8._descriptor;
      local_1488.events = 0;
      local_1488.revents = 0;
      pStack_1480.fd = local_14a0._descriptor;
      pStack_1480.events = 0;
      pStack_1480.revents = 0;
      llvm::Twine::str_abi_cxx11_((string *)local_10b8,&local_12a0);
      local_1368[0].twine = (Twine *)&local_1358;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1368,CONCAT44(local_10b8._4_4_,local_10b8._0_4_),
                 CONCAT44(CStack_10b0._4_4_,CStack_10b0.decUI) +
                 CONCAT44(local_10b8._4_4_,local_10b8._0_4_));
      local_1348 = 0;
      local_1340 = &local_1330;
      local_1338 = 0;
      local_1330 = 0;
      local_1320 = '\0';
      local_1318 = 0x10;
      if ((undefined1 *)CONCAT44(local_10b8._4_4_,local_10b8._0_4_) != auStack_10a8) {
        operator_delete((undefined1 *)CONCAT44(local_10b8._4_4_,local_10b8._0_4_),
                        CONCAT44(auStack_10a8._4_4_,auStack_10a8._0_4_) + 1);
      }
      PVar6.id = local_1550.id;
      local_1458._M_allocated_capacity = 0;
      local_1458._8_8_ = 0;
      local_1458._M_allocated_capacity = (size_type)operator_new(0x18);
      pPVar36 = local_1548;
      PVar7.id = local_1550.id;
      pPVar35 = local_1558;
      ((StringRef *)local_1458._M_allocated_capacity)->Data = (char *)local_1548;
      *(ProcessContext **)
       &(((SmallVectorImpl<char> *)local_1458._M_allocated_capacity)->
        super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.Size = local_1558;
      local_1550.id._0_1_ = (undefined1)PVar6.id;
      local_1550.id._1_1_ = SUB81(PVar6.id,1);
      local_1550.id._2_6_ = SUB86(PVar6.id,2);
      *(undefined1 *)(local_1458._M_allocated_capacity + 0x10) = (undefined1)local_1550.id;
      *(undefined1 *)(local_1458._M_allocated_capacity + 0x11) = local_1550.id._1_1_;
      *(undefined6 *)(local_1458._M_allocated_capacity + 0x12) = local_1550.id._2_6_;
      local_1440 = std::
                   _Function_handler<bool_(llvm::StringRef),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp:976:5)>
                   ::_M_invoke;
      local_1448.twine =
           (Twine *)std::
                    _Function_handler<bool_(llvm::StringRef),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp:976:5)>
                    ::_M_manager;
      local_1438._M_allocated_capacity = 0;
      local_1438._8_8_ = 0;
      local_1550.id = PVar7.id;
      local_1438._M_allocated_capacity = (size_type)operator_new(0x20);
      *(ProcessDelegate **)local_1438._M_allocated_capacity = pPVar36;
      *(Child **)(local_1438._M_allocated_capacity + 8) = local_1368;
      *(ProcessContext **)(local_1438._M_allocated_capacity + 0x10) = pPVar35;
      *(uint64_t *)(local_1438._M_allocated_capacity + 0x18) = PVar6.id;
      local_1428[1] =
           std::
           _Function_handler<bool_(llvm::StringRef),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp:982:5)>
           ::_M_invoke;
      local_1428[0] =
           std::
           _Function_handler<bool_(llvm::StringRef),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp:982:5)>
           ::_M_manager;
      if (attr.connectToConsole == true) {
        if (attr.controlEnabled != false) {
LAB_001653d9:
          pStack_1480.events = 1;
          goto LAB_001653eb;
        }
      }
      else {
        local_1488.events = 1;
        if (attr.controlEnabled == true) goto LAB_001653d9;
LAB_001653eb:
        do {
          __fds = &local_1488;
          if (local_1488.fd != local_14e8._descriptor) {
            __assert_fail("readfds[0].fd == outputPipeParentEnd.unsafeDescriptor()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp"
                          ,0x42f,
                          "void llbuild::basic::spawnProcess(ProcessDelegate &, ProcessContext *, ProcessGroup &, ProcessHandle, ArrayRef<StringRef>, POSIXEnvironment, ProcessAttributes, ProcessReleaseFn &&, ProcessCompletionFn &&)"
                         );
          }
          if (pStack_1480.fd != local_14a0._descriptor) {
            __assert_fail("readfds[1].fd == controlPipeParentEnd.unsafeDescriptor()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp"
                          ,0x430,
                          "void llbuild::basic::spawnProcess(ProcessDelegate &, ProcessContext *, ProcessGroup &, ProcessHandle, ArrayRef<StringRef>, POSIXEnvironment, ProcessAttributes, ProcessReleaseFn &&, ProcessCompletionFn &&)"
                         );
          }
          iVar29 = poll(__fds,2,-1);
          if (iVar29 == -1) {
            piVar19 = __errno_location();
            do {
              PVar6.id = local_1550.id;
              iVar29 = *piVar19;
              if ((iVar29 != 0xb) && (iVar29 != 4)) {
                llvm::Twine::Twine((Twine *)&local_1508,"failed to poll (");
                pcVar21 = strerror(iVar29);
                llvm::Twine::Twine((Twine *)&local_14b8,pcVar21);
                pPVar35 = local_1558;
                if (((NodeKind)local_14f8 == NullKind) || (local_14a8 == NullKind)) {
                  local_1568 = 0x100;
                }
                else {
                  if ((NodeKind)local_14f8 == EmptyKind) {
                    local_1568._1_1_ = cStack_14a7;
                    local_1568._0_1_ = local_14a8;
                    uStack_1566 = uStack_14a6;
                  }
                  else {
                    if (local_14a8 != EmptyKind) {
                      NVar24 = (NodeKind)local_14f8;
                      if (local_14f8._1_1_ != EmptyKind) {
                        local_1508.twine = (Twine *)&local_1508;
                        NVar24 = TwineKind;
                      }
                      if (cStack_14a7 != '\x01') {
                        local_14a8 = TwineKind;
                        local_14b8.twine = (Twine *)&local_14b8;
                      }
                      llvm::Twine::Twine((Twine *)local_1578,local_1508,NVar24,local_14b8,local_14a8
                                        );
                      goto LAB_00165957;
                    }
                    local_1568._0_1_ = (NodeKind)local_14f8;
                    local_1568._1_1_ = local_14f8._1_1_;
                    uStack_1566 = uStack_14f6;
                    local_14b8 = local_1508;
                    CStack_14b0 = CStack_1500;
                  }
                  local_1578._8_8_ = CStack_14b0.twine;
                  local_1578._0_8_ = local_14b8.twine;
                }
LAB_00165957:
                llvm::Twine::Twine((Twine *)&local_14d0,")");
                pPVar36 = local_1548;
                if (((NodeKind)local_1568 == NullKind) || (local_14c0 == NullKind)) {
                  local_1528._0_2_ = 0x100;
                }
                else {
                  if ((NodeKind)local_1568 == EmptyKind) {
                    uVar15._1_1_ = cStack_14bf;
                    uVar15._0_1_ = local_14c0;
                    uVar15._2_6_ = uStack_14be;
                  }
                  else {
                    if (local_14c0 != EmptyKind) {
                      CVar31 = (Child)local_1578._0_8_;
                      NVar24 = (NodeKind)local_1568;
                      if (local_1568._1_1_ != EmptyKind) {
                        CVar31.twine = (Twine *)local_1578;
                        NVar24 = TwineKind;
                      }
                      if (cStack_14bf != '\x01') {
                        local_14c0 = TwineKind;
                        local_14d0.twine = (Twine *)&local_14d0;
                      }
                      llvm::Twine::Twine((Twine *)local_1538,CVar31,NVar24,local_14d0,local_14c0);
                      goto LAB_00165a10;
                    }
                    local_14d0 = (Child)local_1578._0_8_;
                    CStack_14c8 = (Child)local_1578._8_8_;
                    uVar15 = _local_1568;
                  }
                  local_1528[0] = (NodeKind)uVar15;
                  local_1528[1] = SUB81(uVar15,1);
                  local_1528._2_6_ = SUB86(uVar15,2);
                  local_1538._8_8_ = CStack_14c8.twine;
                  local_1538._0_8_ = local_14d0.twine;
                }
LAB_00165a10:
                (*pPVar36->_vptr_ProcessDelegate[3])(pPVar36,pPVar35,PVar6.id,local_1538);
                goto LAB_00165a24;
              }
              iVar29 = poll(__fds,2,-1);
            } while (iVar29 == -1);
          }
          bVar10 = false;
          paVar27 = &local_1458;
          bVar37 = true;
          do {
            bVar28 = bVar37;
            if ((__fds->revents & 0x19) == 0) {
LAB_001654be:
              bVar10 = (bool)(bVar10 | __fds->events != 0);
            }
            else {
              sVar20 = read(__fds->fd,(string *)local_10b8,0x1000);
              if (sVar20 < 0) {
                piVar19 = __errno_location();
                PVar6.id = local_1550.id;
                iVar29 = *piVar19;
                llvm::Twine::Twine((Twine *)&local_1508,"unable to read process output (");
                pcVar21 = strerror(iVar29);
                llvm::Twine::Twine((Twine *)&local_14b8,pcVar21);
                if (((NodeKind)local_14f8 == NullKind) || (local_14a8 == NullKind)) {
                  local_1568 = 0x100;
                }
                else {
                  if ((NodeKind)local_14f8 == EmptyKind) {
                    local_1568._1_1_ = cStack_14a7;
                    local_1568._0_1_ = local_14a8;
                    uStack_1566 = uStack_14a6;
                    local_1578._0_8_ = local_14b8;
                    local_1578._8_8_ = CStack_14b0;
                  }
                  else {
                    if (local_14a8 != EmptyKind) {
                      NVar24 = (NodeKind)local_14f8;
                      if (local_14f8._1_1_ != EmptyKind) {
                        NVar24 = TwineKind;
                      }
                      CVar31 = local_1508;
                      if (local_14f8._1_1_ != EmptyKind) {
                        CVar31.twine = (Twine *)&local_1508;
                      }
                      NVar32 = local_14a8;
                      if (cStack_14a7 != '\x01') {
                        NVar32 = TwineKind;
                      }
                      CVar34 = local_14b8;
                      if (cStack_14a7 != '\x01') {
                        CVar34.twine = (Twine *)&local_14b8;
                      }
                      llvm::Twine::Twine((Twine *)local_1578,CVar31,NVar24,CVar34,NVar32);
                      goto LAB_001655d0;
                    }
                    local_1568._0_1_ = (NodeKind)local_14f8;
                    local_1568._1_1_ = local_14f8._1_1_;
                    uStack_1566 = uStack_14f6;
                    local_1578._0_8_ = local_1508;
                    local_1578._8_8_ = CStack_1500;
                  }
                }
LAB_001655d0:
                llvm::Twine::Twine((Twine *)&local_14d0,")");
                if (((NodeKind)local_1568 == NullKind) || (local_14c0 == NullKind)) {
                  local_1528._0_2_ = 0x100;
                }
                else {
                  if ((NodeKind)local_1568 == EmptyKind) {
                    uVar4._1_1_ = cStack_14bf;
                    uVar4._0_1_ = local_14c0;
                    uVar4._2_6_ = uStack_14be;
                    local_1538._0_8_ = local_14d0;
                    local_1538._8_8_ = CStack_14c8;
                  }
                  else {
                    if (local_14c0 != EmptyKind) {
                      NVar24 = (NodeKind)local_1568;
                      if (local_1568._1_1_ != EmptyKind) {
                        NVar24 = TwineKind;
                      }
                      CVar31 = (Child)local_1578._0_8_;
                      if (local_1568._1_1_ != EmptyKind) {
                        CVar31.twine = (Twine *)local_1578;
                      }
                      NVar32 = local_14c0;
                      if (cStack_14bf != '\x01') {
                        NVar32 = TwineKind;
                      }
                      CVar34 = local_14d0;
                      if (cStack_14bf != '\x01') {
                        CVar34.twine = (Twine *)&local_14d0;
                      }
                      llvm::Twine::Twine((Twine *)local_1538,CVar31,NVar24,CVar34,NVar32);
                      goto LAB_0016568c;
                    }
                    local_1538._0_8_ = local_1578._0_8_;
                    local_1538._8_8_ = local_1578._8_8_;
                    uVar4 = _local_1568;
                  }
                  local_1528[0] = (NodeKind)uVar4;
                  local_1528[1] = SUB81(uVar4,1);
                  local_1528._2_6_ = SUB86(uVar4,2);
                }
LAB_0016568c:
                (*local_1548->_vptr_ProcessDelegate[3])(local_1548,local_1558,PVar6.id,local_1538);
              }
              else if (sVar20 != 0) {
                local_1538._8_8_ = sVar20;
                local_1538._0_8_ = (string *)local_10b8;
                if ((&paVar27->_M_allocated_capacity)[2] == 0) goto LAB_00165ea0;
                cVar11 = (*(code *)(&paVar27->_M_allocated_capacity)[3])(paVar27,local_1538);
                if (cVar11 != '\0') goto LAB_001654be;
              }
              __fds->events = 0;
            }
            paVar27 = &local_1438;
            __fds = &pStack_1480;
            bVar37 = false;
          } while (bVar28);
          if (local_1320 != '\0') {
            this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
            FVar8 = local_14e8._descriptor;
            this->_M_use_count = 1;
            this->_M_weak_count = 1;
            this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001ff398;
            *(FileDescriptor *)&this[1]._vptr__Sp_counted_base = local_14e8._descriptor;
            local_14e8._descriptor = 0xffffffff;
            uVar13 = 0;
            if (FVar8 < 0) {
              uVar13 = local_14e8._4_4_;
            }
            *(char *)((long)&this[1]._vptr__Sp_counted_base + 4) = (char)uVar13;
            local_14e8._closedProperly = true;
            *(char **)&this[1]._M_use_count = local_14e8._file;
            *(uint *)&this[2]._vptr__Sp_counted_base = local_14e8._line;
            this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
            FVar8 = local_14a0._descriptor;
            PVar6.id = local_1550.id;
            uVar13 = local_157c;
            this_00->_M_use_count = 1;
            this_00->_M_weak_count = 1;
            this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001ff398;
            *(FileDescriptor *)&this_00[1]._vptr__Sp_counted_base = local_14a0._descriptor;
            local_14a0._descriptor = 0xffffffff;
            uVar30 = 0;
            if (FVar8 < 0) {
              uVar30 = local_14a0._4_4_;
            }
            local_13f8 = this_00 + 1;
            *(char *)((long)&this_00[1]._vptr__Sp_counted_base + 4) = (char)uVar30;
            local_14a0._closedProperly = true;
            *(char **)&this_00[1]._M_use_count = local_14a0._file;
            *(uint *)&this_00[2]._vptr__Sp_counted_base = local_14a0._line;
            if (__libc_single_threaded == '\0') {
              LOCK();
              this->_M_use_count = this->_M_use_count + 1;
              UNLOCK();
              if (__libc_single_threaded != '\0') goto LAB_00165aca;
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this->_M_use_count = this->_M_use_count + 1;
LAB_00165aca:
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
            local_1578 = (undefined1  [16])0x0;
            p_Var1 = (completionFn->super__Function_base)._M_manager;
            p_Var2 = completionFn->_M_invoker;
            if (p_Var1 != (_Manager_type)0x0) {
              local_1578 = *(undefined1 (*) [16])
                            &(completionFn->super__Function_base)._M_functor._M_unused;
              *(undefined1 (*) [16])&(completionFn->super__Function_base)._M_manager =
                   (undefined1  [16])0x0;
            }
            local_1528._0_16_ = (undefined1  [16])0x0;
            local_1538 = (undefined1  [16])0x0;
            p_Stack_13f0 = this_00;
            local_13e8 = (pthread_mutex_t *)(this + 1);
            p_Stack_13e0 = this;
            puVar22 = (undefined8 *)operator_new(0x68);
            *puVar22 = local_1548;
            puVar22[1] = local_1460;
            *(uint *)(puVar22 + 2) = uVar13;
            puVar22[3] = PVar6.id;
            puVar22[4] = local_1558;
            puVar22[5] = local_13e8;
            puVar22[6] = p_Stack_13e0;
            puVar22[7] = local_13f8;
            puVar22[8] = p_Stack_13f0;
            puVar22[9] = 0;
            puVar22[10] = 0;
            puVar22[0xb] = 0;
            puVar22[0xc] = p_Var2;
            if (p_Var1 != (_Manager_type)0x0) {
              *(undefined8 *)(puVar22 + 9) = local_1578._0_8_;
              *(undefined8 *)(puVar22 + 10) = local_1578._8_8_;
              puVar22[0xb] = p_Var1;
            }
            local_1538._0_8_ = puVar22;
            local_1528._8_8_ =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp:1107:17)>
                 ::_M_invoke;
            local_1528._0_8_ =
                 std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp:1107:17)>
                 ::_M_manager;
            if ((releaseFn->super__Function_base)._M_manager == (_Manager_type)0x0)
            goto LAB_00165ea0;
            (*releaseFn->_M_invoker)((_Any_data *)releaseFn,(function<void_()> *)local_1538);
            if ((_Manager_type)local_1528._0_8_ != (_Manager_type)0x0) {
              (*(code *)local_1528._0_8_)
                        ((_Any_data *)local_1538,(_Any_data *)local_1538,__destroy_functor);
            }
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            goto LAB_00165a24;
          }
        } while (bVar10);
      }
      FVar8 = local_14e8._descriptor;
      pPVar36 = local_1548;
      if (-1 < local_14e8._descriptor) {
        local_14e8._descriptor = 0xffffffff;
        local_14e8._closedProperly = true;
        sys::close(FVar8);
      }
      cleanUpExecutedProcess
                (pPVar36,local_1460,local_157c,local_1550,local_1558,completionFn,&local_14a0);
LAB_00165a24:
      lVar14 = -0x40;
      paVar27 = &local_1438;
      do {
        if ((code *)(&paVar27->_M_allocated_capacity)[2] != (code *)0x0) {
          (*(code *)(&paVar27->_M_allocated_capacity)[2])(paVar27,paVar27,3);
        }
        paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar27->_M_allocated_capacity + -4);
        lVar14 = lVar14 + 0x20;
      } while (lVar14 != 0);
      if (local_1340 != &local_1330) {
        operator_delete(local_1340,CONCAT71(uStack_132f,local_1330) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1368[0].twine != &local_1358) {
        operator_delete(local_1368[0].twine,
                        CONCAT62(local_1358._M_allocated_capacity._2_6_,
                                 local_1358._M_allocated_capacity._0_2_) + 1);
      }
    }
  }
  if ((((local_14a0._descriptor < 0) && (local_14a0._closedProperly != false)) &&
      (local_14e8._descriptor < 0)) && (local_14e8._closedProperly != false)) {
    if (local_1388 != &local_1378) {
      operator_delete(local_1388,CONCAT71(uStack_1377,local_1378) + 1);
    }
    if (local_13d0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (char **)0x0) {
      operator_delete(local_13d0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_13d0.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_13d0.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1418);
    return;
  }
LAB_00165ea5:
  __assert_fail("!isValid() && _closedProperly",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp"
                ,0x102,"ManagedDescriptor::~ManagedDescriptor()");
}

Assistant:

void llbuild::basic::spawnProcess(
    ProcessDelegate& delegate,
    ProcessContext* ctx,
    ProcessGroup& pgrp,
    ProcessHandle handle,
    ArrayRef<StringRef> commandLine,
    POSIXEnvironment environment,
    ProcessAttributes attr,
    ProcessReleaseFn&& releaseFn,
    ProcessCompletionFn&& completionFn
) {
  llbuild_pid_t pid = (llbuild_pid_t)-1;
  
#if !defined(_WIN32) && !defined(HAVE_POSIX_SPAWN)
  auto result = ProcessResult::makeFailed();
  delegate.processStarted(ctx, handle, pid);
  delegate.processHadError(ctx, handle, Twine("process spawning is unavailable"));
  delegate.processFinished(ctx, handle, result);
  completionFn(result);
  return;
#else
  // Don't use lane release feature for console workloads.
  if (attr.connectToConsole) {
    attr.controlEnabled = false;
  }

#if defined(_WIN32)
  // Control channel support is broken (thread-unsafe) on Windows.
  attr.controlEnabled = false;
#endif

  if (commandLine.size() == 0) {
    auto result = ProcessResult::makeFailed();
    delegate.processStarted(ctx, handle, pid);
    delegate.processHadError(ctx, handle, Twine("no arguments for command"));
    delegate.processFinished(ctx, handle, result);
    completionFn(result);
    return;
  }

  // Form the complete C string command line.
  std::vector<std::string> argsStorage(commandLine.begin(), commandLine.end());
#if defined(_WIN32)
  std::string args = llbuild::basic::formatWindowsCommandString(argsStorage);

  // Convert the command line string to utf16
  llvm::SmallVector<llvm::UTF16, 20> u16Executable;
  llvm::SmallVector<llvm::UTF16, 20> u16CmdLine;
  llvm::convertUTF8ToUTF16String(argsStorage[0], u16Executable);
  llvm::convertUTF8ToUTF16String(args, u16CmdLine);
#else
  std::vector<const char*> args(argsStorage.size() + 1);
  for (size_t i = 0; i != argsStorage.size(); ++i) {
    args[i] = argsStorage[i].c_str();
  }
  args[argsStorage.size()] = nullptr;
#endif

#if defined(_WIN32)
  DWORD creationFlags = NORMAL_PRIORITY_CLASS |
                        CREATE_UNICODE_ENVIRONMENT;
  PROCESS_INFORMATION processInfo = {0};

#else
  // Initialize the spawn attributes.
  posix_spawnattr_t attributes;
  posix_spawnattr_init(&attributes);

  // Unmask all signals.
  sigset_t noSignals;
  sigemptyset(&noSignals);
  posix_spawnattr_setsigmask(&attributes, &noSignals);

  // Reset all signals to default behavior.
  //
  // On Linux, this can only be used to reset signals that are legal to
  // modify, so we have to take care about the set we use.
#if defined(__linux__)
  sigset_t mostSignals;
  sigemptyset(&mostSignals);
  for (int i = 1; i < SIGSYS; ++i) {
    if (i == SIGKILL || i == SIGSTOP) continue;
    sigaddset(&mostSignals, i);
  }
  posix_spawnattr_setsigdefault(&attributes, &mostSignals);
#else
  sigset_t mostSignals;
  sigfillset(&mostSignals);
  sigdelset(&mostSignals, SIGKILL);
  sigdelset(&mostSignals, SIGSTOP);
  posix_spawnattr_setsigdefault(&attributes, &mostSignals);
#endif // else !defined(_WIN32)

  // Establish a separate process group.
  posix_spawnattr_setpgroup(&attributes, 0);

  // Set the attribute flags.
  unsigned flags = POSIX_SPAWN_SETSIGMASK | POSIX_SPAWN_SETSIGDEF;
  if (!attr.connectToConsole) {
    flags |= POSIX_SPAWN_SETPGROUP;
  }

  // Close all other files by default.
  //
  // FIXME: Note that this is an Apple-specific extension, and we will have to
  // do something else on other platforms (and unfortunately, there isn't
  // really an easy answer other than using a stub executable).
#ifdef __APPLE__
  flags |= POSIX_SPAWN_CLOEXEC_DEFAULT;
#endif

  // On Darwin, set the QoS of launched processes to one of the current thread.
#ifdef __APPLE__
  posix_spawnattr_set_qos_class_np(&attributes, qos_class_self());
#endif

  posix_spawnattr_setflags(&attributes, flags);

  // Setup the file actions.
  posix_spawn_file_actions_t fileActions;
  posix_spawn_file_actions_init(&fileActions);

  bool usePosixSpawnChdirFallback = true;
  const auto workingDir = attr.workingDir.str();
  if (!workingDir.empty() &&
      posix_spawn_file_actions_addchdir(&fileActions, workingDir.c_str()) != ENOSYS) {
    usePosixSpawnChdirFallback = false;
  }

#endif

#if defined(_WIN32)
  /// Process startup information for Windows.
  STARTUPINFOW startupInfo = {0};
  PlatformSpecificPipesConfig& pipesConfig = startupInfo;
#else
  PlatformSpecificPipesConfig& pipesConfig = fileActions;
#endif

  // Automatically managed (released) descriptors for output and control pipes.
  // The child ends are forwarded to the child (and quickly released in the
  // parent). The parent ends are retained and read/written by the parent.
  ManagedDescriptor outputPipeParentEnd{__FILE__, __LINE__};
  ManagedDescriptor controlPipeParentEnd{__FILE__, __LINE__};

#if defined(_WIN32)
  llvm::SmallVector<llvm::UTF16, 20> u16Cwd;
  std::string workingDir = attr.workingDir.str();
  if (!workingDir.empty()) {
    llvm::convertUTF8ToUTF16String(workingDir, u16Cwd);
  }
#endif

  // Export a task ID to subprocesses.
  auto taskID = Twine::utohexstr(handle.id);
  environment.setIfMissing("LLBUILD_TASK_ID", taskID.str());

  // Resolve the executable path, if necessary.
  //
  // FIXME: This should be cached.
  if (!llvm::sys::path::is_absolute(argsStorage[0])) {
    auto res = llvm::sys::findProgramByName(argsStorage[0]);
    if (!res.getError()) {
      argsStorage[0] = *res;
#if defined(_WIN32)
      u16Executable.clear();
      llvm::convertUTF8ToUTF16String(argsStorage[0], u16Executable);
#else
      args[0] = argsStorage[0].c_str();
#endif
    }
  }

  // Spawn the command.
  bool wasCancelled;
  do {
      // We need to hold the spawn processes lock when we spawn, to ensure that
      // we don't create a process in between when we are cancelled.
      std::lock_guard<std::mutex> guard(pgrp.mutex);
      wasCancelled = pgrp.isClosed();

      // If we have been cancelled since we started, skip startup.
      if (wasCancelled) { break; }

      // The partf of the control pipes that are inherited by the child.
      ManagedDescriptor outputPipeChildEnd{__FILE__, __LINE__};
      ManagedDescriptor controlPipeChildEnd{__FILE__, __LINE__};

      // Open the communication channel under the mutex to avoid
      // leaking the wrong channel into other children started concurrently.
      auto errorPair = createCommunicationPipes(attr, pipesConfig, outputPipeParentEnd, outputPipeChildEnd, controlPipeParentEnd, controlPipeChildEnd);
      if (errorPair.first != CommunicationPipesCreationError::ERROR_NONE) {
        std::string whatPipe = errorPair.first == CommunicationPipesCreationError::OUTPUT_PIPE_FAILED ? "output pipe" : "control pipe";
#if !defined(_WIN32)
        posix_spawn_file_actions_destroy(&fileActions);
        posix_spawnattr_destroy(&attributes);
#endif
        delegate.processStarted(ctx, handle, pid);
        delegate.processHadError(ctx, handle,
            Twine("unable to open " + whatPipe + " (") + strerror(errorPair.second) + ")");
        delegate.processFinished(ctx, handle, ProcessResult::makeFailed());
        completionFn(ProcessResult(ProcessStatus::Failed));
        return;
      }

      if (controlPipeChildEnd.isValid()) {
        long long controlFd = (long long)controlPipeChildEnd.unsafeDescriptor();
        environment.setIfMissing("LLBUILD_CONTROL_FD", Twine(controlFd).str());
      }

      int result = 0;

      bool workingDirectoryUnsupported = false;

#if !defined(_WIN32)
      if (usePosixSpawnChdirFallback) {
#if defined(__APPLE__)
        thread_local std::string threadWorkingDir;

        if (workingDir.empty()) {
          if (!threadWorkingDir.empty()) {
            pthread_fchdir_np(-1);
            threadWorkingDir.clear();
          }
        } else {
          if (threadWorkingDir != workingDir) {
            if (pthread_chdir_np(workingDir.c_str()) == -1) {
              result = errno;
            } else {
              threadWorkingDir = workingDir;
            }
          }
        }
#else
        if (!workingDir.empty()) {
          workingDirectoryUnsupported = true;
          result = -1;
        }
#endif // if defined(__APPLE__)
      }
#endif // else !defined(_WIN32)

      if (result == 0) {
#if defined(_WIN32)
        auto unicodeEnv = environment.getWindowsEnvp();
        result = !CreateProcessW(
            /*lpApplicationName=*/(LPWSTR)u16Executable.data(),
            (LPWSTR)u16CmdLine.data(),
            /*lpProcessAttributes=*/NULL,
            /*lpThreadAttributes=*/NULL,
            /*bInheritHandles=*/TRUE, creationFlags,
            /*lpEnvironment=*/unicodeEnv.get(),
            /*lpCurrentDirectory=*/u16Cwd.empty() ? NULL
                                                  : (LPWSTR)u16Cwd.data(),
            &startupInfo, &processInfo);
#else
        result =
            posix_spawn(&pid, args[0], /*file_actions=*/&fileActions,
                        /*attrp=*/&attributes, const_cast<char**>(args.data()),
                        const_cast<char* const*>(environment.getEnvp()));
#endif
      }
    
      delegate.processStarted(ctx, handle, pid);

      if (result != 0) {
        auto processResult = ProcessResult::makeFailed();
#if defined(_WIN32)
        result = GetLastError();
#endif
        delegate.processHadError(
            ctx, handle,
            workingDirectoryUnsupported
                ? Twine("working-directory unsupported on this platform")
                : Twine("unable to spawn process '") + argsStorage[0] + "' (" + sys::strerror(result) +
                      ")");
        delegate.processFinished(ctx, handle, processResult);
        pid = (llbuild_pid_t)-1;
      } else {
#if defined(_WIN32)
        pid = processInfo.hProcess;
#endif
        ProcessInfo info{ attr.canSafelyInterrupt };
        pgrp.add(std::move(guard), pid, info);
      }

    // Close the child ends of the forwarded output and control pipes.
    controlPipeChildEnd.close();
    outputPipeChildEnd.close();
  } while(false);

#if !defined(_WIN32)
  posix_spawn_file_actions_destroy(&fileActions);
  posix_spawnattr_destroy(&attributes);
#endif

  // If we failed to launch a process, clean up and abort.
  if (pid == (llbuild_pid_t)-1) {
    // Manually close to avoid triggering debug-time leak check.
    outputPipeParentEnd.close();
    controlPipeParentEnd.close();
    auto result = wasCancelled ? ProcessResult::makeCancelled() : ProcessResult::makeFailed();
    completionFn(result);
    return;
  }

#if !defined(_WIN32)
  // Set up our poll() structures. We use assert() to ensure
  // the file descriptors are alive.
  pollfd readfds[] = {
    { outputPipeParentEnd.unsafeDescriptor(), 0, 0 },
    { controlPipeParentEnd.unsafeDescriptor(), 0, 0 }
  };
  bool activeEvents = false;
#endif
  const int nfds = 2;
  ControlProtocolState control(taskID.str());
  std::function<bool (StringRef)> readCbs[] = {
    // output capture callback
    [&delegate, ctx, handle](StringRef buf) -> bool {
      // Notify the client of the output.
      delegate.processHadOutput(ctx, handle, buf);
      return true;
    },
    // control callback handle
    [&delegate, &control, ctx, handle](StringRef buf) mutable -> bool {
      std::string errstr;
      int ret = control.read(buf, &errstr);
      if (ret < 0) {
        delegate.processHadError(ctx, handle,
                                 Twine("control protocol error" + errstr));
      }
      return (ret == 0);
    }
  };
#if defined(_WIN32)
  struct threadData {
    std::function<void(void*)> reader;
    const ManagedDescriptor& handle;
    std::function<bool(StringRef)> cb;
  };
  HANDLE readers[2] = {NULL, NULL};
  auto reader = [&delegate, handle, ctx](void* lpArgs) {
    threadData* args = (threadData*)lpArgs;
    for (;;) {
      char buf[4096];
      DWORD numBytes;
      bool result = ReadFile(args->handle.unsafeDescriptor(), buf, sizeof(buf), &numBytes, NULL);

      if (!result || numBytes == 0) {
        if (GetLastError() == ERROR_BROKEN_PIPE) {
          // Pipe done, exit
          return;
        } else {
          delegate.processHadError(ctx, handle,
                                   Twine("unable to read process output (") +
                                       sys::strerror(GetLastError()) + ")");
        }
      }

      if (numBytes <= 0 || !args->cb(StringRef(buf, numBytes))) {
        continue;
      }
    }
  };

  struct threadData outputThreadParams = {reader, outputPipeParentEnd, readCbs[0]};
  struct threadData controlThreadParams = {reader, controlPipeParentEnd, readCbs[1]};
  HANDLE threads[2] = {NULL, NULL};
#endif // defined(_WIN32)

  int threadCount = 0;

  // Read the command output, if capturing instead of pass-throughing.
  if (!attr.connectToConsole) {
#if defined(_WIN32)
    threads[threadCount++] = (HANDLE)_beginthread(
        [](LPVOID lpParams) { ((threadData*)lpParams)->reader(lpParams); }, 0,
        &outputThreadParams);
#else
    readfds[0].events = POLLIN;
    activeEvents = true;
    (void)threadCount;
#endif
  }

  // Process the control channel input.
  if (attr.controlEnabled) {
#if defined(_WIN32)
    threads[threadCount++] = (HANDLE)_beginthread(
        [](LPVOID lpParams) { ((threadData*)lpParams)->reader(lpParams); }, 0,
        &controlThreadParams);
#else
    readfds[1].events = POLLIN;
    activeEvents = true;
#endif
  }

#if defined(_WIN32)
  DWORD waitResult = WaitForMultipleObjects(threadCount, threads,
                                            /*bWaitAll=*/false,
                                            /*dwMilliseconds=*/INFINITE);
  if (WAIT_FAILED == waitResult || WAIT_TIMEOUT == waitResult) {
    int err = GetLastError();
    delegate.processHadError(
        ctx, handle, Twine("failed to poll (") + sys::strerror(err) + ")");
  }
#else  // !defined(_WIN32)
  while (activeEvents) {
    char buf[4096];
    activeEvents = false;

    // Ensure we haven't autoclosed the file descriptors,
    // or move()d somewhere they could be autoclosed in.
    assert(readfds[0].fd == outputPipeParentEnd.unsafeDescriptor());
    assert(readfds[1].fd == controlPipeParentEnd.unsafeDescriptor());

    while (poll(readfds, nfds, -1) == -1) {
        int err = errno;

        if (err == EAGAIN || err == EINTR) {
          continue;
        } else {
          delegate.processHadError(ctx, handle,
            Twine("failed to poll (") + strerror(err) + ")"); 
          return;
        }
    }

    for (int i = 0; i < nfds; i++) {
      if (readfds[i].revents & (POLLIN | POLLERR | POLLHUP)) {
        ssize_t numBytes = read(readfds[i].fd, buf, sizeof(buf));
        if (numBytes < 0) {
          int err = errno;
          delegate.processHadError(ctx, handle,
              Twine("unable to read process output (") + strerror(err) + ")");
        }
        if (numBytes <= 0 || !readCbs[i](StringRef(buf, numBytes))) {
          readfds[i].events = 0;
          continue;
        }
      }
      activeEvents |= readfds[i].events != 0;
    }

    if (control.shouldRelease()) {
      std::shared_ptr<ManagedDescriptor> outputFdShared
        = std::make_shared<ManagedDescriptor>(std::move(outputPipeParentEnd));
      std::shared_ptr<ManagedDescriptor> controlFdShared
        = std::make_shared<ManagedDescriptor>(std::move(controlPipeParentEnd));
      releaseFn([&delegate, &pgrp, pid, handle, ctx,
                 outputFdShared, controlFdShared,
                 completionFn=std::move(completionFn)]() mutable {
        if (outputFdShared->isValid()) {
          captureExecutedProcessOutput(delegate, *outputFdShared, handle, ctx);
        }
        cleanUpExecutedProcess(delegate, pgrp, pid, handle, ctx,
                               std::move(completionFn), *controlFdShared);
      });
      return;
    }

  }
#endif // else !defined(_WIN32)
  // If we have reached here, both the control and read pipes have given us
  // the requisite EOF/hang-up events. Safe to close the read end of the
  // output pipe.
  outputPipeParentEnd.close();
  cleanUpExecutedProcess(delegate, pgrp, pid, handle, ctx,
                         std::move(completionFn), controlPipeParentEnd);
#endif
}